

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O1

bool __thiscall
HawkTracer::parser::KlassRegister::klass_exists(KlassRegister *this,HT_EventKlassId klass_id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  bool bVar7;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->_register)._M_h._M_bucket_count;
  uVar4 = (ulong)klass_id % uVar1;
  p_Var5 = (this->_register)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     *(HT_EventKlassId *)&p_Var5->_M_nxt[1]._M_nxt != klass_id)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var2[1]._M_nxt == klass_id)) goto LAB_0010f113;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0010f113:
  if (p_Var6 == (__node_base_ptr)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = p_Var6->_M_nxt != (_Hash_node_base *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar7;
}

Assistant:

bool KlassRegister::klass_exists(HT_EventKlassId klass_id) const
{
    lock_guard l(_register_mtx);
    return _register.find(klass_id) != _register.end();
}